

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O0

string * benchmark::GetBigOString_abi_cxx11_(BigO complexity)

{
  undefined4 in_ESI;
  string *in_RDI;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"(1)",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"N",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"N^2",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"N^3",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"lgN",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"NlgN",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"f(N)",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
  }
  return in_RDI;
}

Assistant:

std::string GetBigOString(BigO complexity) {
  switch (complexity) {
    case oN:
      return "N";
    case oNSquared:
      return "N^2";
    case oNCubed:
      return "N^3";
    case oLogN:
      return "lgN";
    case oNLogN:
      return "NlgN";
    case o1:
      return "(1)";
    default:
      return "f(N)";
  }
}